

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

bool Js::JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties
               (RecyclableObject *object)

{
  bool bVar1;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_20;
  
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::WriteBarrierSet
            (&local_20,
             &((((object->type).ptr)->javascriptLibrary).ptr)->
              typesWithOnlyWritablePropertyProtoChain);
  bVar1 = PrototypeChainCache<Js::OnlyWritablePropertyCache>::Check(local_20.ptr,object);
  return bVar1;
}

Assistant:

bool JavascriptOperators::CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(_In_ RecyclableObject* object)
    {
        return object->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Check(object);
    }